

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwarmonDevice.h
# Opt level: O0

int ConnectSwarmonDevice(SWARMONDEVICE *pSwarmonDevice,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *ptr2;
  char *ptr1;
  char *ptr0;
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  SWARMONDEVICE *pSwarmonDevice_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  memset(pSwarmonDevice->szCfgFilePath,0,0x100);
  sprintf(pSwarmonDevice->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&ptr0,0,0x100);
    memset(pSwarmonDevice->szRequest,0,0x100);
    sprintf(pSwarmonDevice->szRequest,"http://193.52.45.70:3000/rt/lastposition/robotTest");
    pSwarmonDevice->threadperiod = 100;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr0,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr0,"%255s",pSwarmonDevice->szRequest);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,(char *)&ptr0,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(&ptr0,"%d",&pSwarmonDevice->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pSwarmonDevice->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pSwarmonDevice->threadperiod = 100;
  }
  memset(&pSwarmonDevice->LastSwarmonData,0,0x28);
  memset(pSwarmonDevice->address,0,0x100);
  memset(pSwarmonDevice->port,0,0x100);
  memset(pSwarmonDevice->resource,0,0x100);
  pcVar2 = strstr(pSwarmonDevice->szRequest,"http://");
  if (pcVar2 == (char *)0x0) {
    pSwarmonDevice->DevType = 0;
    pcVar2 = strchr(pSwarmonDevice->szRequest,0x3a);
    if (pcVar2 != (char *)0x0) {
      memcpy(pSwarmonDevice->address,pSwarmonDevice->szRequest,
             (long)pcVar2 - (long)pSwarmonDevice->szRequest);
      strcpy(pSwarmonDevice->port,pcVar2 + 1);
    }
  }
  else {
    pSwarmonDevice->DevType = 1;
    pcVar3 = strchr(pcVar2 + 7,0x3a);
    if (pcVar3 != (char *)0x0) {
      memcpy(pSwarmonDevice->address,pcVar2 + 7,(long)pcVar3 - (long)(pcVar2 + 7));
      pcVar2 = strchr(pcVar3 + 1,0x2f);
      if (pcVar2 == (char *)0x0) {
        strcpy(pSwarmonDevice->port,pcVar3 + 1);
      }
      else {
        memcpy(pSwarmonDevice->port,pcVar3 + 1,(long)pcVar2 - (long)(pcVar3 + 1));
        strcpy(pSwarmonDevice->resource,pcVar2 + 1);
      }
    }
  }
  if ((pSwarmonDevice->address[0] == '\0') || (pSwarmonDevice->port[0] == '\0')) {
    printf("Invalid parameter : szRequest.\n");
    memset(pSwarmonDevice->szRequest,0,0x100);
    sprintf(pSwarmonDevice->szRequest,"http://193.52.45.70:3000/rt/lastposition/robotTest");
    sprintf(pSwarmonDevice->address,"193.52.45.70");
    sprintf(pSwarmonDevice->port,"3000");
    sprintf(pSwarmonDevice->resource,"rt/lastposition/robotTest");
    pSwarmonDevice->DevType = 1;
  }
  iVar1 = inittcpcli(&pSwarmonDevice->s,pSwarmonDevice->address,pSwarmonDevice->port);
  if (iVar1 == 0) {
    printf("SwarmonDevice connected.\n");
  }
  else {
    printf("Unable to connect to a SwarmonDevice.\n");
  }
  pSwarmonDevice_local._4_4_ = (uint)(iVar1 != 0);
  return pSwarmonDevice_local._4_4_;
}

Assistant:

inline int ConnectSwarmonDevice(SWARMONDEVICE* pSwarmonDevice, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	char* ptr0 = NULL;
	char* ptr1 = NULL;
	char* ptr2 = NULL;

	memset(pSwarmonDevice->szCfgFilePath, 0, sizeof(pSwarmonDevice->szCfgFilePath));
	sprintf(pSwarmonDevice->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pSwarmonDevice->szRequest, 0, sizeof(pSwarmonDevice->szRequest));
		sprintf(pSwarmonDevice->szRequest, "http://193.52.45.70:3000/rt/lastposition/robotTest");
		pSwarmonDevice->threadperiod = 100;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pSwarmonDevice->szRequest) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pSwarmonDevice->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pSwarmonDevice->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pSwarmonDevice->threadperiod = 100;
	}

	memset(&pSwarmonDevice->LastSwarmonData, 0, sizeof(SWARMONDATA));

	memset(pSwarmonDevice->address, 0, sizeof(pSwarmonDevice->address));
	memset(pSwarmonDevice->port, 0, sizeof(pSwarmonDevice->port));
	memset(pSwarmonDevice->resource, 0, sizeof(pSwarmonDevice->resource));

	// Try to determine whether it is an HTTP request or an IP address and TCP port.
	ptr0 = strstr(pSwarmonDevice->szRequest, "http://");
	if (ptr0)
	{
		pSwarmonDevice->DevType = SWARMONDEVICE_TYPE_INTERNET;
		ptr1 = strchr(ptr0+strlen("http://"), ':');
		if (ptr1)
		{
			memcpy(pSwarmonDevice->address, ptr0+strlen("http://"), ptr1-(ptr0+strlen("http://")));
			ptr2 = strchr(ptr1+1, '/');
			if (ptr2)
			{
				memcpy(pSwarmonDevice->port, ptr1+1, ptr2-(ptr1+1));
				strcpy(pSwarmonDevice->resource, ptr2+1);
			}
			else
			{
				strcpy(pSwarmonDevice->port, ptr1+1);
			}
		}
	}
	else
	{
		pSwarmonDevice->DevType = SWARMONDEVICE_TYPE_LOCAL;
		ptr0 = strchr(pSwarmonDevice->szRequest, ':');
		if (ptr0)
		{
			memcpy(pSwarmonDevice->address, pSwarmonDevice->szRequest, ptr0-pSwarmonDevice->szRequest);
			strcpy(pSwarmonDevice->port, ptr0+1);
		}
	}

	if (!(pSwarmonDevice->address[0])||!(pSwarmonDevice->port[0]))
	{
		printf("Invalid parameter : szRequest.\n");
		memset(pSwarmonDevice->szRequest, 0, sizeof(pSwarmonDevice->szRequest));
		sprintf(pSwarmonDevice->szRequest, "http://193.52.45.70:3000/rt/lastposition/robotTest");
		sprintf(pSwarmonDevice->address, "193.52.45.70");
		sprintf(pSwarmonDevice->port, "3000");
		sprintf(pSwarmonDevice->resource, "rt/lastposition/robotTest");
		pSwarmonDevice->DevType = SWARMONDEVICE_TYPE_INTERNET;
	}

	if (inittcpcli(&pSwarmonDevice->s, pSwarmonDevice->address, pSwarmonDevice->port) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a SwarmonDevice.\n");
		return EXIT_FAILURE;
	}

	printf("SwarmonDevice connected.\n");

	return EXIT_SUCCESS;
}